

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O2

bool cdftocsv::getdamagebindictionary
               (vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec_)

{
  FILE *__stream;
  ulong uVar1;
  void *__ptr;
  size_t sVar2;
  ulong __n;
  long lVar3;
  
  __stream = fopen("static/damage_bin_dict.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: Erroropening %s\n","static/damage_bin_dict.bin");
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    __n = uVar1 / 0x14 & 0xffffffff;
    __ptr = operator_new__(__n * 0x14);
    sVar2 = fread(__ptr,0x14,__n,__stream);
    if (sVar2 == __n) {
      for (lVar3 = 0; (uVar1 / 0x14 & 0xffffffff) * 0x14 - lVar3 != 0; lVar3 = lVar3 + 0x14) {
        std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::push_back
                  (damagebindictionary_vec_,(value_type *)((long)__ptr + lVar3));
      }
      operator_delete__(__ptr);
      fclose(__stream);
      return true;
    }
    fwrite("FATAL: Error reading file\n",0x1a,1,_stderr);
  }
  exit(-1);
}

Assistant:

bool getdamagebindictionary(std::vector<damagebindictionary> &damagebindictionary_vec_)
	{

		FILE *fin = fopen(DAMAGE_BIN_DICT_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Erroropening %s\n", DAMAGE_BIN_DICT_FILE);
			exit(-1);
		}
		flseek(fin, 0L, SEEK_END);
		long long sz = fltell(fin);
		flseek(fin, 0L, SEEK_SET);
		unsigned int nrec = static_cast<unsigned int> (sz / sizeof(damagebindictionary));
		damagebindictionary *s1 = new damagebindictionary[nrec];
		if (fread(s1, sizeof(damagebindictionary), nrec, fin) != nrec) {
			fprintf(stderr, "FATAL: Error reading file\n");
			exit(-1);
		}

		for (unsigned int i = 0; i < nrec; i++) {
			damagebindictionary_vec_.push_back(s1[i]);
		}
		delete[] s1;

		fclose(fin);
		return true;
	}